

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall TPZManVector<long,_19>::~TPZManVector(TPZManVector<long,_19> *this)

{
  TPZManVector<long,_19> *in_RDI;
  
  ~TPZManVector(in_RDI);
  operator_delete(in_RDI,0xb8);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}